

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

string * __thiscall
t_st_generator::prefix(string *__return_storage_ptr__,t_st_generator *this,string *class_name)

{
  t_program *this_00;
  string prefix;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  this_00 = (this->super_t_oop_generator).super_t_generator.program_;
  std::__cxx11::string::string((string *)&local_40,"smalltalk.prefix",(allocator *)&local_80);
  t_program::get_namespace(&local_a0,this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_60,(string *)class_name);
  t_generator::capitalize(__return_storage_ptr__,(t_generator *)this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (local_a0._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_80,(string *)__return_storage_ptr__);
  }
  else {
    std::operator+(&local_80,&local_a0,__return_storage_ptr__);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::prefix(string class_name) {
  string prefix = program_->get_namespace("smalltalk.prefix");
  string name = capitalize(class_name);
  name = prefix.empty() ? name : (prefix + name);
  return name;
}